

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O0

_Bool borg_equips_dragon(int drag_sval)

{
  int iVar1;
  int iVar2;
  borg_item_conflict *item;
  int denominator;
  int numerator;
  int skill;
  int fail;
  int lev;
  int drag_sval_local;
  
  iVar2 = z_info->pack_size + 6;
  if ((borg_items[iVar2].iqty == '\0') || ((borg_items[iVar2].aware & 1U) == 0)) {
    lev._3_1_ = false;
  }
  else if (borg_items[iVar2].tval == '\x12') {
    if ((uint)borg_items[iVar2].sval == drag_sval) {
      if (borg_items[iVar2].timeout == 0) {
        if ((borg_items[iVar2].ident & 1U) == 0) {
          lev._3_1_ = false;
        }
        else {
          denominator = borg.trait[0x38];
          if (borg.trait[0x72] != 0) {
            denominator = (denominator * 0x4b) / 100;
          }
          iVar1 = (denominator - (uint)borg_items[iVar2].level) + -0x8c;
          item._4_4_ = ((uint)borg_items[iVar2].level - denominator) + -0x5a;
          if ((item._4_4_ == 0) && (item._4_4_ = -1, 0 < iVar1)) {
            item._4_4_ = 1;
          }
          if ((iVar1 * 100) / item._4_4_ < 0x1f5) {
            lev._3_1_ = true;
          }
          else {
            lev._3_1_ = false;
          }
        }
      }
      else {
        lev._3_1_ = false;
      }
    }
    else {
      lev._3_1_ = false;
    }
  }
  else {
    lev._3_1_ = false;
  }
  return lev._3_1_;
}

Assistant:

bool borg_equips_dragon(int drag_sval)
{
    int lev, fail;
    int skill;
    int numerator;
    int denominator;

    /* Check the equipment */
    borg_item *item = &borg_items[INVEN_BODY];

    if (!item->iqty || !item->aware)
        return false;

    /* Skip incorrect armours */
    if (item->tval != TV_DRAG_ARMOR)
        return false;
    if (item->sval != drag_sval)
        return false;

    /* Check charge */
    if (item->timeout)
        return false;

    /*  Make Sure Mail is IDed */
    if (!item->ident)
        return false;

    /* check on fail rate
     * The fail check is automatic for dragon armor.  It is an attack
     * item.  He should not sit around failing 5 or 6 times in a row.
     * he should attempt to activate it, and if he is likely to fail, then
     * eh should look at a different attack option.  We are assuming
     * that the fail rate is about 50%.  So He may still try to activate it
     * and fail.  But he will not even try if he has negative chance or
     * less than twice the USE_DEVICE variable
     */
    /* Extract the item level */
    lev = item->level;

    /* Base chance of success */
    skill = borg.trait[BI_DEV];

    /* Confusion hurts skill */
    if (borg.trait[BI_ISCONFUSED])
        skill = skill * 75 / 100;

    /* High level objects are harder */
    numerator   = (skill - lev) - (141 - 1);
    denominator = (lev - skill) - (100 - 10);

    /* Make sure that we don't divide by zero */
    if (denominator == 0)
        denominator = numerator > 0 ? 1 : -1;

    fail = (100 * numerator) / denominator;

    /* Roll for usage, but if its a Teleport be generous. */
    if (fail > 500)
        return false;

    /* Success */
    return true;
}